

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_ignored_stdio(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int r;
  
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x2eb,"r == 0");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x2ee,"r == 0");
    abort();
  }
  if (exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x2f0,"exit_cb_called == 1");
    abort();
  }
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x2f1,"close_cb_called == 1");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x2f3,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(spawn_ignored_stdio) {
  int r;

  init_process_options("spawn_helper6", exit_cb);

  options.stdio = NULL;
  options.stdio_count = 0;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}